

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_has_any_or_all.cpp
# Opt level: O0

void duckdb::ListHasAnyFunction(DataChunk *args,ExpressionState *param_2,Vector *result)

{
  anon_class_40_5_f9ad11e0 fun;
  byte bVar1;
  LogicalType *pLVar2;
  LogicalType *this;
  LogicalType *pLVar3;
  bool *pbVar4;
  VectorType in_DL;
  DataChunk *in_RDI;
  string_set_t set;
  string_t *r_sortkey_ptr;
  string_t *l_sortkey_ptr;
  OrderModifiers order_modifiers;
  Vector r_sortkey_vec;
  Vector l_sortkey_vec;
  UnifiedVectorFormat r_child_format;
  UnifiedVectorFormat l_child_format;
  Vector *r_child;
  Vector *l_child;
  idx_t r_size;
  idx_t l_size;
  value_type *r_vec;
  value_type *l_vec;
  size_type in_stack_fffffffffffffcd8;
  vector<duckdb::Vector,_true> *in_stack_fffffffffffffce0;
  Vector *this_00;
  undefined7 in_stack_fffffffffffffd48;
  byte bVar5;
  byte bVar6;
  undefined7 in_stack_fffffffffffffd60;
  string_set_t *in_stack_fffffffffffffd90;
  string_t *local_238;
  string_t *local_230;
  OrderModifiers local_226;
  OrderModifiers local_224;
  OrderModifiers local_222;
  LogicalType local_220 [24];
  Vector local_208 [104];
  LogicalType local_1a0 [24];
  Vector local_188 [104];
  UnifiedVectorFormat local_120 [72];
  UnifiedVectorFormat local_d8 [72];
  Vector *local_90;
  Vector *local_88;
  UnifiedVectorFormat *local_80;
  UnifiedVectorFormat *local_78;
  byte local_69;
  LogicalType local_68 [40];
  LogicalType local_40 [24];
  reference local_28;
  Vector *local_20;
  VectorType local_18;
  DataChunk *local_8;
  
  local_8 = in_RDI;
  local_18 = in_DL;
  local_20 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  local_28 = vector<duckdb::Vector,_true>::operator[]
                       (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
  pLVar2 = Vector::GetType(local_20);
  this = (LogicalType *)duckdb::ListType::GetChildType(pLVar2);
  pLVar2 = local_40;
  duckdb::LogicalType::LogicalType(pLVar2,SQLNULL);
  local_69 = 0;
  bVar1 = duckdb::LogicalType::operator==(this,pLVar2);
  bVar5 = 1;
  if ((bVar1 & 1) == 0) {
    pLVar3 = Vector::GetType(local_28);
    pLVar3 = (LogicalType *)duckdb::ListType::GetChildType(pLVar3);
    duckdb::LogicalType::LogicalType(local_68,SQLNULL);
    local_69 = 1;
    bVar5 = duckdb::LogicalType::operator==(pLVar3,local_68);
  }
  bVar6 = bVar5;
  if ((local_69 & 1) != 0) {
    duckdb::LogicalType::~LogicalType(local_68);
  }
  duckdb::LogicalType::~LogicalType(local_40);
  if ((bVar5 & 1) == 0) {
    local_78 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(local_20);
    local_80 = (UnifiedVectorFormat *)duckdb::ListVector::GetListSize(local_28);
    local_88 = (Vector *)duckdb::ListVector::GetEntry(local_20);
    local_90 = (Vector *)duckdb::ListVector::GetEntry(local_28);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_d8);
    duckdb::UnifiedVectorFormat::UnifiedVectorFormat(local_120);
    duckdb::Vector::ToUnifiedFormat((ulong)local_88,local_78);
    duckdb::Vector::ToUnifiedFormat((ulong)local_90,local_80);
    duckdb::LogicalType::LogicalType(local_1a0,BLOB);
    duckdb::Vector::Vector(local_188,local_1a0,local_78);
    duckdb::LogicalType::~LogicalType(local_1a0);
    duckdb::LogicalType::LogicalType(local_220,BLOB);
    duckdb::Vector::Vector(local_208,local_220,local_80);
    duckdb::LogicalType::~LogicalType(local_220);
    OrderModifiers::OrderModifiers(&local_222,ASCENDING,NULLS_LAST);
    local_224 = local_222;
    duckdb::CreateSortKeyHelpers::CreateSortKey(local_88,(ulong)local_78,local_222,local_188);
    local_226 = local_222;
    duckdb::CreateSortKeyHelpers::CreateSortKey(local_90,(ulong)local_80,local_222,local_208);
    local_230 = FlatVector::GetData<duckdb::string_t>((Vector *)0xd4e97f);
    local_238 = FlatVector::GetData<duckdb::string_t>((Vector *)0xd4e9a0);
    std::
    unordered_set<duckdb::string_t,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<duckdb::string_t>_>
    ::unordered_set((unordered_set<duckdb::string_t,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<duckdb::string_t>_>
                     *)0xd4e9c6);
    DataChunk::size(local_8);
    this_00 = (Vector *)&local_238;
    fun.r_sortkey_ptr = (string_t **)local_d8;
    fun.l_sortkey_ptr = (string_t **)this_00;
    fun.l_child_format = local_120;
    fun.r_child_format = (UnifiedVectorFormat *)&stack0xfffffffffffffd90;
    fun.set = in_stack_fffffffffffffd90;
    BinaryExecutor::
    Execute<duckdb::list_entry_t,duckdb::list_entry_t,bool,duckdb::ListHasAnyFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0>
              ((Vector *)CONCAT17(bVar1,in_stack_fffffffffffffd60),(Vector *)pLVar2,(Vector *)this,
               CONCAT17(bVar6,in_stack_fffffffffffffd48),fun);
    std::
    unordered_set<duckdb::string_t,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<duckdb::string_t>_>
    ::~unordered_set((unordered_set<duckdb::string_t,_duckdb::StringHash,_duckdb::StringEquality,_std::allocator<duckdb::string_t>_>
                      *)0xd4ea93);
    Vector::~Vector(this_00);
    Vector::~Vector(this_00);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)this_00);
    UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)this_00);
  }
  else {
    duckdb::Vector::SetVectorType(local_18);
    pbVar4 = ConstantVector::GetData<bool>((Vector *)0xd4e75e);
    *pbVar4 = false;
  }
  return;
}

Assistant:

static void ListHasAnyFunction(DataChunk &args, ExpressionState &, Vector &result) {

	auto &l_vec = args.data[0];
	auto &r_vec = args.data[1];

	if (ListType::GetChildType(l_vec.GetType()) == LogicalType::SQLNULL ||
	    ListType::GetChildType(r_vec.GetType()) == LogicalType::SQLNULL) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
		ConstantVector::GetData<bool>(result)[0] = false;
		return;
	}

	const auto l_size = ListVector::GetListSize(l_vec);
	const auto r_size = ListVector::GetListSize(r_vec);

	auto &l_child = ListVector::GetEntry(l_vec);
	auto &r_child = ListVector::GetEntry(r_vec);

	// Setup unified formats for the list elements
	UnifiedVectorFormat l_child_format;
	UnifiedVectorFormat r_child_format;

	l_child.ToUnifiedFormat(l_size, l_child_format);
	r_child.ToUnifiedFormat(r_size, r_child_format);

	// Create the sort keys for the list elements
	Vector l_sortkey_vec(LogicalType::BLOB, l_size);
	Vector r_sortkey_vec(LogicalType::BLOB, r_size);

	const OrderModifiers order_modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);

	CreateSortKeyHelpers::CreateSortKey(l_child, l_size, order_modifiers, l_sortkey_vec);
	CreateSortKeyHelpers::CreateSortKey(r_child, r_size, order_modifiers, r_sortkey_vec);

	const auto l_sortkey_ptr = FlatVector::GetData<string_t>(l_sortkey_vec);
	const auto r_sortkey_ptr = FlatVector::GetData<string_t>(r_sortkey_vec);

	string_set_t set;

	BinaryExecutor::Execute<list_entry_t, list_entry_t, bool>(
	    l_vec, r_vec, result, args.size(), [&](const list_entry_t &l_list, const list_entry_t &r_list) {
		    // Short circuit if either list is empty
		    if (l_list.length == 0 || r_list.length == 0) {
			    return false;
		    }

		    auto build_list = l_list;
		    auto probe_list = r_list;

		    auto build_data = l_sortkey_ptr;
		    auto probe_data = r_sortkey_ptr;

		    auto build_format = &l_child_format;
		    auto probe_format = &r_child_format;

		    // Use the smaller list to build the set
		    if (r_list.length < l_list.length) {

			    build_list = r_list;
			    probe_list = l_list;

			    build_data = r_sortkey_ptr;
			    probe_data = l_sortkey_ptr;

			    build_format = &r_child_format;
			    probe_format = &l_child_format;
		    }

		    // Reset the set
		    set.clear();

		    // Build the set
		    for (auto idx = build_list.offset; idx < build_list.offset + build_list.length; idx++) {
			    const auto entry_idx = build_format->sel->get_index(idx);
			    if (build_format->validity.RowIsValid(entry_idx)) {
				    set.insert(build_data[entry_idx]);
			    }
		    }
		    // Probe the set
		    for (auto idx = probe_list.offset; idx < probe_list.offset + probe_list.length; idx++) {
			    const auto entry_idx = probe_format->sel->get_index(idx);
			    if (probe_format->validity.RowIsValid(entry_idx) && set.find(probe_data[entry_idx]) != set.end()) {
				    return true;
			    }
		    }
		    return false;
	    });
}